

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O1

void __thiscall
ConfidentialTransaction_GetPegoutPubkeyDataTest_Test::
~ConfidentialTransaction_GetPegoutPubkeyDataTest_Test
          (ConfidentialTransaction_GetPegoutPubkeyDataTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ConfidentialTransaction, GetPegoutPubkeyDataTest) {
  // liquid_pak
  Pubkey online_pubkey("02a71e193ce21075d0966be16724e41fff666366d7ac13e3616a329005da4024da");
  // liquid_pak_privkey
  Privkey master_online_key = Privkey::FromWif(
      "cPoefvB147bYpWCf9JqRBVMXENt4isSBAn91RYeiBh1jUp3ThhKN", NetType::kTestnet, true);
  std::string bitcoin_descriptor = "sh(wpkh(tpubDBwZbsX7C1m4tfHxHSFBvvuasqMxzMvSNM5yuAWz6kAfCATAgegvrtGdnxkqfr8wwRZi5d9fJHXqE8EFTSogTXd3xVx3GUFy9Xcg8dufREz/0/*))";
  ByteData whitelist("020061b08c4c80dc04aaa0b44018d2c4bcdb0d9c0992fb4fddf9d2fb096a5164c002a71e193ce21075d0966be16724e41fff666366d7ac13e3616a329005da4024da");
  NetType net_type = NetType::kTestnet;
  ByteData pubkey_prefix = ByteData("043587cf");
  uint32_t bip32_counter = 0;
  PegoutKeyData key_data;

  Address addr;
  for (const auto& testdata : kGetPegoutPubkeyDataTestVector) {
    EXPECT_NO_THROW(
      (key_data = ConfidentialTransaction::GetPegoutPubkeyData(
          online_pubkey, master_online_key, bitcoin_descriptor, bip32_counter,
          whitelist, net_type, pubkey_prefix, NetType::kElementsRegtest, &addr)));
    EXPECT_STREQ(
        key_data.btc_pubkey_bytes.GetHex().c_str(),
        testdata.btc_pubkey_bytes.c_str());
    EXPECT_STREQ(
        key_data.whitelist_proof.GetHex().c_str(),
        testdata.whitelist_proof.c_str());
    EXPECT_STREQ(
        addr.GetAddress().c_str(),
        testdata.address.c_str());

    auto pegout_addr = ConfidentialTransaction::GetPegoutAddressFromDescriptor(
        bitcoin_descriptor, bip32_counter, net_type,
        NetType::kElementsRegtest);
    EXPECT_STREQ(
        pegout_addr.GetAddress().c_str(),
        testdata.address.c_str());
    ++bip32_counter;
  }
}